

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int reparse_additive_expr(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx)

{
  uint16_t exp_idx_00;
  uint16_t exp_idx_01;
  int iVar1;
  bool bVar2;
  uint16_t prev_mul_exp;
  uint16_t prev_add_exp;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  ly_ctx *ctx_local;
  
  exp_idx_00 = *exp_idx;
  while( true ) {
    exp_idx_01 = *exp_idx;
    iVar1 = reparse_unary_expr(ctx,exp,exp_idx);
    if (iVar1 != 0) {
      return -1;
    }
    while( true ) {
      iVar1 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_OPERATOR_MATH,0);
      bVar2 = false;
      if ((iVar1 == 0) && (bVar2 = true, exp->expr[exp->expr_pos[*exp_idx]] != '*')) {
        bVar2 = exp->tok_len[*exp_idx] == 3;
      }
      if (!bVar2) break;
      exp_repeat_push(exp,exp_idx_01,6);
      *exp_idx = *exp_idx + 1;
      iVar1 = reparse_unary_expr(ctx,exp,exp_idx);
      if (iVar1 != 0) {
        return -1;
      }
    }
    iVar1 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_OPERATOR_MATH,0);
    bVar2 = false;
    if ((iVar1 == 0) && (bVar2 = true, exp->expr[exp->expr_pos[*exp_idx]] != '+')) {
      bVar2 = exp->expr[exp->expr_pos[*exp_idx]] == '-';
    }
    if (!bVar2) break;
    exp_repeat_push(exp,exp_idx_00,5);
    *exp_idx = *exp_idx + 1;
  }
  return 0;
}

Assistant:

static int
reparse_additive_expr(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx)
{
    uint16_t prev_add_exp, prev_mul_exp;

    prev_add_exp = *exp_idx;
    goto reparse_multiplicative_expr;

    /* ('+' / '-' MultiplicativeExpr)* */
    while (!exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0)
            && ((exp->expr[exp->expr_pos[*exp_idx]] == '+') || (exp->expr[exp->expr_pos[*exp_idx]] == '-'))) {
        exp_repeat_push(exp, prev_add_exp, LYXP_EXPR_ADDITIVE);
        ++(*exp_idx);

reparse_multiplicative_expr:
        /* UnaryExpr */
        prev_mul_exp = *exp_idx;
        if (reparse_unary_expr(ctx, exp, exp_idx)) {
            return -1;
        }

        /* ('*' / 'div' / 'mod' UnaryExpr)* */
        while (!exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0)
                && ((exp->expr[exp->expr_pos[*exp_idx]] == '*') || (exp->tok_len[*exp_idx] == 3))) {
            exp_repeat_push(exp, prev_mul_exp, LYXP_EXPR_MULTIPLICATIVE);
            ++(*exp_idx);

            if (reparse_unary_expr(ctx, exp, exp_idx)) {
                return -1;
            }
        }
    }

    return EXIT_SUCCESS;
}